

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O1

int mbedtls_rsa_pkcs1_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t ilen,uchar *input,uchar *output)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  bool bVar7;
  
  if (ctx->padding != 0) {
    return -0x4100;
  }
  uVar1 = ctx->len;
  iVar3 = -0x4080;
  if ((ilen + 0xb <= uVar1 && ilen < 0xfffffffffffffff5) &&
     (*output = '\0', f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) {
    lVar5 = (uVar1 - ilen) + -3;
    puVar6 = output + 2;
    output[1] = '\x02';
    do {
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar7) {
        *puVar6 = '\0';
        if (ilen != 0) {
          switchD_00337c71::default(puVar6 + 1,input,ilen);
        }
        iVar3 = mbedtls_rsa_public(ctx,output,output);
        return iVar3;
      }
      iVar3 = 100;
      do {
        iVar2 = (*f_rng)(p_rng,puVar6,1);
        iVar4 = iVar3;
        if ((*puVar6 != '\0') || (iVar4 = iVar3 + -1, iVar3 == 1)) break;
        iVar3 = iVar4;
      } while (iVar2 == 0);
      iVar3 = iVar2 + -0x4480;
      puVar6 = puVar6 + (iVar2 == 0 && iVar4 != 0);
    } while (iVar2 == 0 && iVar4 != 0);
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_pkcs1_encrypt(mbedtls_rsa_context *ctx,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng,
                              size_t ilen,
                              const unsigned char *input,
                              unsigned char *output)
{
    switch (ctx->padding) {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsaes_pkcs1_v15_encrypt(ctx, f_rng, p_rng,
                                                       ilen, input, output);
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsaes_oaep_encrypt(ctx, f_rng, p_rng, NULL, 0,
                                                  ilen, input, output);
#endif

        default:
            return MBEDTLS_ERR_RSA_INVALID_PADDING;
    }
}